

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

lhcell * lhFindSibeling(lhcell *pCell)

{
  lhcell *plVar1;
  lhcell **pplVar2;
  
  pplVar2 = &pCell->pPage->pMaster->pFirst;
  while( true ) {
    plVar1 = *pplVar2;
    if ((plVar1 == (lhcell *)0x0) ||
       ((plVar1->pPage == pCell->pPage && (plVar1->iNext == pCell->iStart)))) break;
    pplVar2 = &plVar1->pPrev;
  }
  return plVar1;
}

Assistant:

static lhcell * lhFindSibeling(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	lhcell *pEntry;
	pEntry = pPage->pFirst; 
	while( pEntry ){
		if( pEntry->pPage == pCell->pPage && pEntry->iNext == pCell->iStart ){
			/* Sibeling found */
			return pEntry;
		}
		/* Point to the previous entry */
		pEntry = pEntry->pPrev; 
	}
	/* Last inserted cell */
	return 0;
}